

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

int yaml_parser_update_buffer(yaml_parser_t *parser,size_t length)

{
  yaml_encoding_t yVar1;
  yaml_char_t *pyVar2;
  yaml_char_t *__src;
  yaml_char_t *pyVar3;
  short *psVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  byte *pbVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    __assert_fail("parser->read_handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/reader.c"
                  ,0x92,"int yaml_parser_update_buffer(yaml_parser_t *, size_t)");
  }
  if ((parser->eof == 0) || ((parser->raw_buffer).pointer != (parser->raw_buffer).last)) {
    iVar5 = 1;
    if (parser->unread < length) {
      if (parser->encoding == YAML_ANY_ENCODING) {
        do {
          psVar4 = (short *)(parser->raw_buffer).pointer;
          lVar16 = (long)(parser->raw_buffer).last - (long)psVar4;
          if (parser->eof != 0) {
            if (1 < lVar16) goto LAB_001b6536;
LAB_001b6569:
            parser->encoding = YAML_UTF8_ENCODING;
            goto LAB_001b64ac;
          }
          if (2 < lVar16) {
LAB_001b6536:
            if (*psVar4 == -0x101) {
              parser->encoding = YAML_UTF16LE_ENCODING;
            }
            else {
              if (*psVar4 != -2) {
                if ((lVar16 == 2) || ((char)psVar4[1] != -0x41 || *psVar4 != -0x4411))
                goto LAB_001b6569;
                parser->encoding = YAML_UTF8_ENCODING;
                (parser->raw_buffer).pointer = (uchar *)((long)psVar4 + 3);
                parser->offset = parser->offset + 3;
                goto LAB_001b64ac;
              }
              parser->encoding = YAML_UTF16BE_ENCODING;
            }
            (parser->raw_buffer).pointer = (uchar *)(psVar4 + 1);
            parser->offset = parser->offset + 2;
            goto LAB_001b64ac;
          }
          iVar5 = yaml_parser_update_raw_buffer(parser);
        } while (iVar5 != 0);
      }
      else {
LAB_001b64ac:
        pyVar2 = (parser->buffer).start;
        __src = (parser->buffer).pointer;
        pyVar3 = (parser->buffer).last;
        if (__src < pyVar3 && pyVar2 < __src) {
          memmove(pyVar2,__src,(long)pyVar3 - (long)__src);
          pyVar2 = (parser->buffer).start;
          (parser->buffer).pointer = pyVar2;
          (parser->buffer).last = pyVar2 + ((long)pyVar3 - (long)__src);
        }
        else if (__src == pyVar3) {
          (parser->buffer).pointer = pyVar2;
          (parser->buffer).last = pyVar2;
        }
        if (parser->unread < length) {
          pbVar12 = (parser->raw_buffer).pointer;
          pbVar15 = (parser->raw_buffer).last;
          if (pbVar12 != pbVar15) goto LAB_001b6648;
          while (iVar5 = yaml_parser_update_raw_buffer(parser), iVar5 != 0) {
            pbVar12 = (parser->raw_buffer).pointer;
            pbVar15 = (parser->raw_buffer).last;
LAB_001b6648:
            if (pbVar12 != pbVar15) {
              do {
                uVar18 = (long)pbVar15 - (long)pbVar12;
                yVar1 = parser->encoding;
                if (yVar1 - YAML_UTF16LE_ENCODING < 2) {
                  if (uVar18 < 2) {
                    if (parser->eof == 0) goto LAB_001b69d9;
                    uVar18 = parser->offset;
                    parser->error = YAML_READER_ERROR;
                    pcVar7 = "incomplete UTF-16 character";
                    goto LAB_001b6a0d;
                  }
                  uVar8 = (uint)CONCAT11(pbVar12[yVar1 == YAML_UTF16LE_ENCODING],
                                         pbVar12[yVar1 != YAML_UTF16LE_ENCODING]);
                  uVar10 = (ulong)uVar8;
                  bVar11 = pbVar12[yVar1 == YAML_UTF16LE_ENCODING] & 0xfc;
                  if (bVar11 != 0xd8) {
                    lVar16 = 2;
                    if (bVar11 != 0xdc) goto LAB_001b6763;
                    sVar6 = parser->offset;
                    parser->error = YAML_READER_ERROR;
                    pcVar7 = "unexpected low surrogate area";
                    goto LAB_001b6b19;
                  }
                  if (uVar18 < 4) {
                    if (parser->eof == 0) goto LAB_001b69d9;
                    uVar18 = parser->offset;
                    parser->error = YAML_READER_ERROR;
                    pcVar7 = "incomplete UTF-16 surrogate pair";
                    goto LAB_001b6a0d;
                  }
                  uVar13 = (uint)CONCAT11(pbVar12[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) ^ 3],
                                          pbVar12[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) + 2]);
                  if ((pbVar12[(ulong)(yVar1 != YAML_UTF16LE_ENCODING) ^ 3] & 0xfc) != 0xdc) {
                    parser->error = YAML_READER_ERROR;
                    parser->problem = "expected low surrogate area";
                    parser->problem_offset = parser->offset + 2;
                    parser->problem_value = uVar13;
                    goto LAB_001b6b24;
                  }
                  uVar10 = (ulong)((uVar8 & 0x3ff) * 0x400 + (uVar13 & 0x3ff) + 0x10000);
                  lVar16 = 4;
LAB_001b6763:
                  if ((0xd < (uint)uVar10) || ((0x2600U >> ((uint)uVar10 & 0x1f) & 1) == 0))
                  goto LAB_001b6786;
                  (parser->raw_buffer).pointer = pbVar12 + lVar16;
                  parser->offset = parser->offset + lVar16;
                }
                else {
                  lVar16 = 0;
                  uVar10 = 0;
                  if (yVar1 == YAML_UTF8_ENCODING) {
                    bVar11 = *pbVar12;
                    uVar10 = (ulong)bVar11;
                    uVar8 = (uint)bVar11;
                    if ((char)bVar11 < '\0') {
                      uVar13 = (uint)bVar11;
                      if ((uVar13 & 0xffffffe0) == 0xc0) {
                        if (1 < uVar18) {
                          uVar17 = 2;
                          uVar14 = 2;
LAB_001b6919:
                          uVar10 = (ulong)(uVar13 & 0x1f);
LAB_001b691c:
                          uVar18 = 1;
                          do {
                            bVar11 = pbVar12[uVar18];
                            if ((bVar11 & 0xffffffc0) != 0x80) {
                              parser->error = YAML_READER_ERROR;
                              parser->problem = "invalid trailing UTF-8 octet";
                              parser->problem_offset = uVar18 + parser->offset;
                              parser->problem_value = (uint)bVar11;
                              goto LAB_001b6b24;
                            }
                            uVar8 = (int)uVar10 << 6;
                            uVar10 = (ulong)(bVar11 & 0x3f | uVar8);
                            uVar18 = uVar18 + 1;
                          } while (uVar17 != uVar18);
                          if ((((uVar14 == 2) && (lVar16 = 2, 0x7f < uVar8)) ||
                              ((uVar14 == 3 && (lVar16 = 3, 0x7ff < uVar8)))) ||
                             ((uVar14 == 4 && (lVar16 = 4, 0xffff < uVar8)))) goto LAB_001b66e8;
                          uVar18 = parser->offset;
                          parser->error = YAML_READER_ERROR;
                          pcVar7 = "invalid length of a UTF-8 sequence";
                          goto LAB_001b6a0d;
                        }
                      }
                      else {
                        uVar14 = 3;
                        uVar9 = (uint)bVar11;
                        if (((uVar13 & 0xfffffff0) != 0xe0) &&
                           (uVar14 = 4, (uVar9 & 0xfffffff8) != 0xf0)) {
                          sVar6 = parser->offset;
                          parser->error = YAML_READER_ERROR;
                          pcVar7 = "invalid leading UTF-8 octet";
                          goto LAB_001b6b19;
                        }
                        uVar17 = (ulong)uVar14;
                        if (uVar17 <= uVar18) {
                          if ((uVar13 & 0xffffffe0) == 0xc0) goto LAB_001b6919;
                          if ((uVar13 & 0xfffffff0) == 0xe0) {
                            uVar10 = (ulong)(uVar9 & 0xf);
                          }
                          else {
                            uVar10 = (ulong)(uVar9 & 7);
                            if ((uVar9 & 0xfffffff8) != 0xf0) {
                              uVar10 = 0;
                            }
                          }
                          goto LAB_001b691c;
                        }
                      }
                    }
                    else {
                      lVar16 = 1;
                      if (pbVar15 != pbVar12) {
LAB_001b66e8:
                        uVar8 = (uint)uVar10;
                        if ((0x10ffff < uVar8) || ((uVar8 & 0xfffff800) == 0xd800)) {
                          sVar6 = parser->offset;
                          parser->error = YAML_READER_ERROR;
                          pcVar7 = "invalid Unicode character";
                          goto LAB_001b6b19;
                        }
                        goto LAB_001b6763;
                      }
                    }
                    if (parser->eof == 0) goto LAB_001b69d9;
                    uVar18 = parser->offset;
                    parser->error = YAML_READER_ERROR;
                    pcVar7 = "incomplete UTF-8 octet sequence";
                    goto LAB_001b6a0d;
                  }
LAB_001b6786:
                  uVar8 = (uint)uVar10;
                  if ((((uVar8 < 0x10000) && (0xd75f < uVar8 - 0xa0)) && (uVar8 != 0x85)) &&
                     ((0x5e < uVar8 - 0x20 && (0x1ffd < uVar8 - 0xe000)))) {
                    sVar6 = parser->offset;
                    parser->error = YAML_READER_ERROR;
                    pcVar7 = "control characters are not allowed";
LAB_001b6b19:
                    parser->problem = pcVar7;
                    parser->problem_offset = sVar6;
                    parser->problem_value = uVar8;
                    goto LAB_001b6b24;
                  }
                  (parser->raw_buffer).pointer = pbVar12 + lVar16;
                  parser->offset = parser->offset + lVar16;
                  if (0x7f < uVar8) {
                    if (uVar8 < 0x800) {
                      bVar11 = (byte)(uVar10 >> 6) | 0xc0;
                    }
                    else {
                      pbVar12 = (parser->buffer).last;
                      (parser->buffer).last = pbVar12 + 1;
                      if (uVar8 < 0x10000) {
                        *pbVar12 = (byte)(uVar8 >> 0xc) | 0xe0;
                      }
                      else {
                        *pbVar12 = (char)(uVar8 >> 0x12) - 0x10;
                        pbVar12 = (parser->buffer).last;
                        (parser->buffer).last = pbVar12 + 1;
                        *pbVar12 = (byte)(uVar10 >> 0xc) & 0x3f | 0x80;
                      }
                      bVar11 = (byte)(uVar10 >> 6) & 0x3f | 0x80;
                    }
                    pbVar12 = (parser->buffer).last;
                    (parser->buffer).last = pbVar12 + 1;
                    *pbVar12 = bVar11;
                    uVar10 = (ulong)((byte)uVar10 & 0x3f | 0x80);
                  }
                }
                pyVar2 = (parser->buffer).last;
                (parser->buffer).last = pyVar2 + 1;
                *pyVar2 = (yaml_char_t)uVar10;
                parser->unread = parser->unread + 1;
                pbVar12 = (parser->raw_buffer).pointer;
                pbVar15 = (parser->raw_buffer).last;
              } while (pbVar12 != pbVar15);
            }
            if (parser->eof != 0) {
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = '\0';
              parser->unread = parser->unread + 1;
              return 1;
            }
LAB_001b69d9:
            if (length <= parser->unread) goto LAB_001b69e6;
          }
        }
        else {
LAB_001b69e6:
          uVar18 = parser->offset;
          if (uVar18 < 0x7fffffffffffffff) {
            return 1;
          }
          parser->error = YAML_READER_ERROR;
          pcVar7 = "input is too long";
LAB_001b6a0d:
          parser->problem = pcVar7;
          parser->problem_offset = uVar18;
          parser->problem_value = -1;
        }
      }
LAB_001b6b24:
      iVar5 = 0;
    }
  }
  else {
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_update_buffer(yaml_parser_t *parser, size_t length)
{
    int first = 1;

    assert(parser->read_handler);   /* Read handler must be set. */

    /* If the EOF flag is set and the raw buffer is empty, do nothing. */

    if (parser->eof && parser->raw_buffer.pointer == parser->raw_buffer.last)
        return 1;

    /* Return if the buffer contains enough characters. */

    if (parser->unread >= length)
        return 1;

    /* Determine the input encoding if it is not known yet. */

    if (!parser->encoding) {
        if (!yaml_parser_determine_encoding(parser))
            return 0;
    }

    /* Move the unread characters to the beginning of the buffer. */

    if (parser->buffer.start < parser->buffer.pointer
            && parser->buffer.pointer < parser->buffer.last) {
        size_t size = parser->buffer.last - parser->buffer.pointer;
        memmove(parser->buffer.start, parser->buffer.pointer, size);
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start + size;
    }
    else if (parser->buffer.pointer == parser->buffer.last) {
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start;
    }

    /* Fill the buffer until it has enough characters. */

    while (parser->unread < length)
    {
        /* Fill the raw buffer if necessary. */

        if (!first || parser->raw_buffer.pointer == parser->raw_buffer.last) {
            if (!yaml_parser_update_raw_buffer(parser)) return 0;
        }
        first = 0;

        /* Decode the raw buffer. */

        while (parser->raw_buffer.pointer != parser->raw_buffer.last)
        {
            unsigned int value = 0, value2 = 0;
            int incomplete = 0;
            unsigned char octet;
            unsigned int width = 0;
            int low, high;
            size_t k;
            size_t raw_unread = parser->raw_buffer.last - parser->raw_buffer.pointer;

            /* Decode the next character. */

            switch (parser->encoding)
            {
                case YAML_UTF8_ENCODING:

                    /*
                     * Decode a UTF-8 character.  Check RFC 3629
                     * (http://www.ietf.org/rfc/rfc3629.txt) for more details.
                     *
                     * The following table (taken from the RFC) is used for
                     * decoding.
                     *
                     *    Char. number range |        UTF-8 octet sequence
                     *      (hexadecimal)    |              (binary)
                     *   --------------------+------------------------------------
                     *   0000 0000-0000 007F | 0xxxxxxx
                     *   0000 0080-0000 07FF | 110xxxxx 10xxxxxx
                     *   0000 0800-0000 FFFF | 1110xxxx 10xxxxxx 10xxxxxx
                     *   0001 0000-0010 FFFF | 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
                     *
                     * Additionally, the characters in the range 0xD800-0xDFFF
                     * are prohibited as they are reserved for use with UTF-16
                     * surrogate pairs.
                     */

                    /* Determine the length of the UTF-8 sequence. */

                    octet = parser->raw_buffer.pointer[0];
                    width = (octet & 0x80) == 0x00 ? 1 :
                            (octet & 0xE0) == 0xC0 ? 2 :
                            (octet & 0xF0) == 0xE0 ? 3 :
                            (octet & 0xF8) == 0xF0 ? 4 : 0;

                    /* Check if the leading octet is valid. */

                    if (!width)
                        return yaml_parser_set_reader_error(parser,
                                "invalid leading UTF-8 octet",
                                parser->offset, octet);

                    /* Check if the raw buffer contains an incomplete character. */

                    if (width > raw_unread) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-8 octet sequence",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Decode the leading octet. */

                    value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                            (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                            (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                            (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

                    /* Check and decode the trailing octets. */

                    for (k = 1; k < width; k ++)
                    {
                        octet = parser->raw_buffer.pointer[k];

                        /* Check if the octet is valid. */

                        if ((octet & 0xC0) != 0x80)
                            return yaml_parser_set_reader_error(parser,
                                    "invalid trailing UTF-8 octet",
                                    parser->offset+k, octet);

                        /* Decode the octet. */

                        value = (value << 6) + (octet & 0x3F);
                    }

                    /* Check the length of the sequence against the value. */

                    if (!((width == 1) ||
                            (width == 2 && value >= 0x80) ||
                            (width == 3 && value >= 0x800) ||
                            (width == 4 && value >= 0x10000)))
                        return yaml_parser_set_reader_error(parser,
                                "invalid length of a UTF-8 sequence",
                                parser->offset, -1);

                    /* Check the range of the value. */

                    if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF)
                        return yaml_parser_set_reader_error(parser,
                                "invalid Unicode character",
                                parser->offset, value);

                    break;

                case YAML_UTF16LE_ENCODING:
                case YAML_UTF16BE_ENCODING:

                    low = (parser->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
                    high = (parser->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

                    /*
                     * The UTF-16 encoding is not as simple as one might
                     * naively think.  Check RFC 2781
                     * (http://www.ietf.org/rfc/rfc2781.txt).
                     *
                     * Normally, two subsequent bytes describe a Unicode
                     * character.  However a special technique (called a
                     * surrogate pair) is used for specifying character
                     * values larger than 0xFFFF.
                     *
                     * A surrogate pair consists of two pseudo-characters:
                     *      high surrogate area (0xD800-0xDBFF)
                     *      low surrogate area (0xDC00-0xDFFF)
                     *
                     * The following formulas are used for decoding
                     * and encoding characters using surrogate pairs:
                     *
                     *  U  = U' + 0x10000   (0x01 00 00 <= U <= 0x10 FF FF)
                     *  U' = yyyyyyyyyyxxxxxxxxxx   (0 <= U' <= 0x0F FF FF)
                     *  W1 = 110110yyyyyyyyyy
                     *  W2 = 110111xxxxxxxxxx
                     *
                     * where U is the character value, W1 is the high surrogate
                     * area, W2 is the low surrogate area.
                     */

                    /* Check for incomplete UTF-16 character. */

                    if (raw_unread < 2) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-16 character",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Get the character. */

                    value = parser->raw_buffer.pointer[low]
                        + (parser->raw_buffer.pointer[high] << 8);

                    /* Check for unexpected low surrogate area. */

                    if ((value & 0xFC00) == 0xDC00)
                        return yaml_parser_set_reader_error(parser,
                                "unexpected low surrogate area",
                                parser->offset, value);

                    /* Check for a high surrogate area. */

                    if ((value & 0xFC00) == 0xD800) {

                        width = 4;

                        /* Check for incomplete surrogate pair. */

                        if (raw_unread < 4) {
                            if (parser->eof) {
                                return yaml_parser_set_reader_error(parser,
                                        "incomplete UTF-16 surrogate pair",
                                        parser->offset, -1);
                            }
                            incomplete = 1;
                            break;
                        }

                        /* Get the next character. */

                        value2 = parser->raw_buffer.pointer[low+2]
                            + (parser->raw_buffer.pointer[high+2] << 8);

                        /* Check for a low surrogate area. */

                        if ((value2 & 0xFC00) != 0xDC00)
                            return yaml_parser_set_reader_error(parser,
                                    "expected low surrogate area",
                                    parser->offset+2, value2);

                        /* Generate the value of the surrogate pair. */

                        value = 0x10000 + ((value & 0x3FF) << 10) + (value2 & 0x3FF);
                    }

                    else {
                        width = 2;
                    }

                    break;

                default:
                    assert(1);      /* Impossible. */
            }

            /* Check if the raw buffer contains enough bytes to form a character. */

            if (incomplete) break;

            /*
             * Check if the character is in the allowed range:
             *      #x9 | #xA | #xD | [#x20-#x7E]               (8 bit)
             *      | #x85 | [#xA0-#xD7FF] | [#xE000-#xFFFD]    (16 bit)
             *      | [#x10000-#x10FFFF]                        (32 bit)
             */

            if (! (value == 0x09 || value == 0x0A || value == 0x0D
                        || (value >= 0x20 && value <= 0x7E)
                        || (value == 0x85) || (value >= 0xA0 && value <= 0xD7FF)
                        || (value >= 0xE000 && value <= 0xFFFD)
                        || (value >= 0x10000 && value <= 0x10FFFF)))
                return yaml_parser_set_reader_error(parser,
                        "control characters are not allowed",
                        parser->offset, value);

            /* Move the raw pointers. */

            parser->raw_buffer.pointer += width;
            parser->offset += width;

            /* Finally put the character into the buffer. */

            /* 0000 0000-0000 007F -> 0xxxxxxx */
            if (value <= 0x7F) {
                *(parser->buffer.last++) = value;
            }
            /* 0000 0080-0000 07FF -> 110xxxxx 10xxxxxx */
            else if (value <= 0x7FF) {
                *(parser->buffer.last++) = 0xC0 + (value >> 6);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0000 0800-0000 FFFF -> 1110xxxx 10xxxxxx 10xxxxxx */
            else if (value <= 0xFFFF) {
                *(parser->buffer.last++) = 0xE0 + (value >> 12);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0001 0000-0010 FFFF -> 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
            else {
                *(parser->buffer.last++) = 0xF0 + (value >> 18);
                *(parser->buffer.last++) = 0x80 + ((value >> 12) & 0x3F);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }

            parser->unread ++;
        }

        /* On EOF, put NUL into the buffer and return. */

        if (parser->eof) {
            *(parser->buffer.last++) = '\0';
            parser->unread ++;
            return 1;
        }

    }

    if (parser->offset >= MAX_FILE_SIZE) {
        return yaml_parser_set_reader_error(parser, "input is too long",
            parser->offset, -1);
    }

    return 1;
}